

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
booster::locale::gettext<char>(char *id,locale *loc)

{
  basic_message<char> *in_RDI;
  char_type *in_stack_ffffffffffffff38;
  basic_message<char> *this;
  
  this = in_RDI;
  basic_message<char>::basic_message(in_RDI,in_stack_ffffffffffffff38);
  basic_message<char>::str_abi_cxx11_(this,(locale *)in_RDI);
  basic_message<char>::~basic_message(in_RDI);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
}

Assistant:

std::basic_string<CharType> gettext(CharType const *id,
                                            std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(id).str(loc);
        }